

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightLeSample * __thiscall
pbrt::DiffuseAreaLight::SampleLe
          (DiffuseAreaLight *this,Point2f *u1,Point2f *u2,SampledWavelengths *lambda,Float time)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  ShapeSample *pSVar10;
  float *pfVar11;
  ShapeSample *this_00;
  ShapeSample *ray;
  Tuple2<pbrt::Point2,_float> *in_RCX;
  long in_RSI;
  int __x;
  LightLeSample *in_RDI;
  Float in_XMM0_Da;
  undefined8 uVar13;
  Frame *this_01;
  undefined8 uVar14;
  undefined1 auVar12 [64];
  float fVar15;
  Vector3f VVar16;
  Tuple3<pbrt::Vector3,_float> TVar17;
  Point3f PVar18;
  SampledSpectrum SVar19;
  Frame nFrame;
  Point2f u;
  Vector3f w;
  optional<pbrt::ShapeSample> ss;
  Float pdfDir;
  LightLeSample *in_stack_fffffffffffffca0;
  Normal3f *in_stack_fffffffffffffcb0;
  ShapeHandle *in_stack_fffffffffffffcb8;
  Float pdfDir_00;
  Float pdfPos;
  Interaction *intr;
  undefined4 in_stack_fffffffffffffcf0;
  Float in_stack_fffffffffffffd30;
  float in_stack_fffffffffffffd34;
  undefined8 in_stack_fffffffffffffd38;
  Frame *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  Float in_stack_fffffffffffffd4c;
  float in_stack_fffffffffffffd50;
  float in_stack_fffffffffffffd54;
  float local_dc;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c8;
  float local_c0;
  float local_bc;
  Tuple2<pbrt::Point2,_float> local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined4 local_a0;
  optional local_90 [96];
  float local_30;
  Float local_2c;
  Tuple2<pbrt::Point2,_float> *local_20;
  
  local_2c = in_XMM0_Da;
  local_20 = in_RCX;
  ShapeHandle::Sample(in_stack_fffffffffffffcb8,(Point2f *)in_stack_fffffffffffffcb0);
  bVar9 = pstd::optional::operator_cast_to_bool(local_90);
  if (bVar9) {
    pSVar10 = pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x6161c4)
    ;
    this_01 = (Frame *)0x0;
    (pSVar10->intr).time = local_2c;
    pSVar10 = pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x616205)
    ;
    (pSVar10->intr).mediumInterface = (MediumInterface *)(in_RSI + 8);
    Vector3<float>::Vector3((Vector3<float> *)0x616230);
    if ((*(byte *)(in_RSI + 0xd0) & 1) == 0) {
      TVar17 = (Tuple3<pbrt::Vector3,_float>)
               SampleCosineHemisphere((Point2f *)in_stack_fffffffffffffcb0);
      local_a8 = TVar17.z;
      auVar6._8_8_ = this_01;
      auVar6._0_8_ = TVar17._0_8_;
      local_b0 = vmovlpd_avx(auVar6);
      in_stack_fffffffffffffd30 = CosineHemispherePDF(local_a8);
      local_30 = in_stack_fffffffffffffd30;
    }
    else {
      local_b8 = *local_20;
      pfVar11 = Tuple2<pbrt::Point2,_float>::operator[](&local_b8,0);
      if (0.5 <= *pfVar11) {
        pfVar11 = Tuple2<pbrt::Point2,_float>::operator[](&local_b8,0);
        local_dc = *pfVar11 + -0.5 + *pfVar11 + -0.5;
        pfVar11 = std::min<float>(&local_dc,(float *)&OneMinusEpsilon);
        fVar15 = *pfVar11;
        pfVar11 = Tuple2<pbrt::Point2,_float>::operator[](&local_b8,0);
        uVar13 = 0;
        *pfVar11 = fVar15;
        __x = (int)&local_b8;
        VVar16 = SampleCosineHemisphere((Point2f *)in_stack_fffffffffffffcb0);
        in_stack_fffffffffffffd54 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar7._8_8_ = uVar13;
        auVar7._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_b0 = vmovlpd_avx(auVar7);
        local_a8 = in_stack_fffffffffffffd54 * -1.0;
        this_01 = in_stack_fffffffffffffd40;
      }
      else {
        pfVar11 = Tuple2<pbrt::Point2,_float>::operator[](&local_b8,0);
        local_bc = *pfVar11 + *pfVar11;
        pfVar11 = std::min<float>(&local_bc,(float *)&OneMinusEpsilon);
        fVar15 = *pfVar11;
        pfVar11 = Tuple2<pbrt::Point2,_float>::operator[](&local_b8,0);
        uVar13 = 0;
        *pfVar11 = fVar15;
        __x = (int)&local_b8;
        VVar16 = SampleCosineHemisphere((Point2f *)in_stack_fffffffffffffcb0);
        local_d0 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar8._8_8_ = uVar13;
        auVar8._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_d8 = vmovlpd_avx(auVar8);
        this_01 = in_stack_fffffffffffffd40;
        local_c8 = local_d8;
        local_c0 = local_d0;
        local_b0 = local_d8;
        local_a8 = local_d0;
      }
      in_stack_fffffffffffffd50 = local_a8;
      std::abs(__x);
      in_stack_fffffffffffffd4c = CosineHemispherePDF(in_stack_fffffffffffffd50);
      TVar17.z = in_stack_fffffffffffffd34;
      TVar17.x = (float)(int)in_stack_fffffffffffffd38;
      TVar17.y = (float)(int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
      local_30 = in_stack_fffffffffffffd4c * 0.5;
    }
    uVar13 = 0;
    if ((local_30 != 0.0) || (NAN(local_30))) {
      pSVar10 = pstd::optional<pbrt::ShapeSample>::operator->
                          ((optional<pbrt::ShapeSample> *)0x616646);
      Frame::FromZ(in_stack_fffffffffffffcb0);
      VVar16 = Frame::FromLocal(this_01,TVar17._0_8_);
      local_a8 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
      uVar14 = 0;
      auVar5._8_8_ = uVar13;
      auVar5._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_b0 = vmovlpd_avx(auVar5);
      pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x6166fb);
      PVar18 = Interaction::p((Interaction *)in_stack_fffffffffffffca0);
      fVar15 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
      uVar13 = 0;
      auVar4._8_8_ = uVar14;
      auVar4._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
      vmovlpd_avx(auVar4);
      this_00 = pstd::optional<pbrt::ShapeSample>::operator->
                          ((optional<pbrt::ShapeSample> *)0x616763);
      intr = (Interaction *)&(this_00->intr).n;
      ray = pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x616785);
      SVar19 = L((DiffuseAreaLight *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 (Point3f *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 (Normal3f *)this_01,TVar17._0_8_,
                 (Vector3f *)CONCAT44(TVar17.z,in_stack_fffffffffffffd30),
                 (SampledWavelengths *)pSVar10);
      pdfDir_00 = (Float)uVar13;
      pdfPos = (Float)((ulong)uVar13 >> 0x20);
      auVar2._8_8_ = uVar14;
      auVar2._0_8_ = SVar19.values.values._8_8_;
      auVar3._8_4_ = pdfDir_00;
      auVar3._0_8_ = SVar19.values.values._0_8_;
      auVar3._12_4_ = pdfPos;
      vmovlpd_avx(auVar3);
      vmovlpd_avx(auVar2);
      pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x6167f8);
      Interaction::SpawnRay(&this_00->intr,(Vector3f *)ray);
      pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x616828);
      pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x616845);
      LightLeSample::LightLeSample
                ((LightLeSample *)CONCAT44(fVar15,in_stack_fffffffffffffcf0),
                 (SampledSpectrum *)this_00,(Ray *)ray,intr,pdfPos,pdfDir_00);
    }
    else {
      auVar12 = ZEXT1664((undefined1  [16])0x0);
      auVar1 = vmovdqu64_avx512f(auVar12);
      *(undefined1 (*) [64])((long)&(in_RDI->intr).optionalValue + 0x20) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar12);
      *(undefined1 (*) [64])((long)&(in_RDI->intr).optionalValue + 8) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar12);
      *(undefined1 (*) [64])in_RDI = auVar1;
      LightLeSample::LightLeSample(in_stack_fffffffffffffca0);
    }
  }
  else {
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    auVar1 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])((long)&(in_RDI->intr).optionalValue + 0x20) = auVar1;
    auVar1 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])((long)&(in_RDI->intr).optionalValue + 8) = auVar1;
    auVar1 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])in_RDI = auVar1;
    LightLeSample::LightLeSample(in_stack_fffffffffffffca0);
  }
  local_a0 = 1;
  pstd::optional<pbrt::ShapeSample>::~optional((optional<pbrt::ShapeSample> *)0x61689a);
  return in_RDI;
}

Assistant:

LightLeSample DiffuseAreaLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                         SampledWavelengths &lambda, Float time) const {
    // Sample a point on the area light's _Shape_
    Float pdfDir;
    pstd::optional<ShapeSample> ss = shape.Sample(u1);
    if (!ss)
        return {};
    ss->intr.time = time;
    ss->intr.mediumInterface = &mediumInterface;

    // Sample a cosine-weighted outgoing direction _w_ for area light
    Vector3f w;
    if (twoSided) {
        Point2f u = u2;
        // Choose a side to sample and then remap u[0] to [0,1] before
        // applying cosine-weighted hemisphere sampling for the chosen side.
        if (u[0] < .5) {
            u[0] = std::min(u[0] * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u);
        } else {
            u[0] = std::min((u[0] - .5f) * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u);
            w.z *= -1;
        }
        pdfDir = 0.5f * CosineHemispherePDF(std::abs(w.z));
    } else {
        w = SampleCosineHemisphere(u2);
        pdfDir = CosineHemispherePDF(w.z);
    }

    if (pdfDir == 0)
        return {};

    // Return _LightLeSample_ for ray leaving area light
    Frame nFrame = Frame::FromZ(ss->intr.n);
    w = nFrame.FromLocal(w);
    return LightLeSample(L(ss->intr.p(), ss->intr.n, ss->intr.uv, w, lambda),
                         ss->intr.SpawnRay(w), ss->intr, ss->pdf, pdfDir);
}